

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void remove_dev(lys_deviation *dev,lys_module *module,unres_schema *unres)

{
  byte bVar1;
  lys_module *plVar2;
  char *__needle;
  lys_module *plVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  uint32_t local_3c;
  lys_module *plStack_38;
  uint32_t idx;
  
  local_3c = 0;
  if (dev->orig_node == (lys_node *)0x0) {
    ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
           ,0x1258);
    return;
  }
  plVar2 = dev->orig_node->module;
  plStack_38 = plVar2;
  if ((plVar2->field_0x40 & 1) != 0) {
    plStack_38 = (lys_module *)plVar2->data;
  }
  lys_switch_deviation(dev,module,unres);
  do {
    do {
      plVar3 = ly_ctx_get_module_iter(module->ctx,&local_3c);
      if (plVar3 == (lys_module *)0x0) {
        plStack_38->field_0x40 = plStack_38->field_0x40 & 0xcf;
        plVar2->field_0x40 = plVar2->field_0x40 & 0xcf;
        return;
      }
    } while ((plVar3 == module) || (plVar3 == plStack_38));
    bVar1 = plVar3->deviation_size;
    for (lVar6 = 0; (ulong)bVar1 * 0x38 - lVar6 != 0; lVar6 = lVar6 + 0x38) {
      __needle = plStack_38->name;
      pcVar4 = strstr(*(char **)((long)&plVar3->deviation->target_name + lVar6),__needle);
      if ((pcVar4 != (char *)0x0) && (sVar5 = strlen(__needle), pcVar4[sVar5] == ':')) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void
remove_dev(struct lys_deviation *dev, const struct lys_module *module, struct unres_schema *unres)
{
    uint32_t idx = 0, j;
    const struct lys_module *mod;
    struct lys_module *target_mod, *target_submod;
    const char *ptr;

    if (dev->orig_node) {
        target_mod = lys_node_module(dev->orig_node);
        target_submod = dev->orig_node->module;
    } else {
        LOGINT(module->ctx);
        return;
    }
    lys_switch_deviation(dev, module, unres);

    /* clear the deviation flag if possible */
    while ((mod = ly_ctx_get_module_iter(module->ctx, &idx))) {
        if ((mod == module) || (mod == target_mod)) {
            continue;
        }

        for (j = 0; j < mod->deviation_size; ++j) {
            ptr = strstr(mod->deviation[j].target_name, target_mod->name);
            if (ptr && (ptr[strlen(target_mod->name)] == ':')) {
                /* some other module deviation targets the inspected module, flag remains */
                break;
            }
        }

        if (j < mod->deviation_size) {
            break;
        }
    }

    if (!mod) {
        target_mod->deviated = 0;    /* main module */
        target_submod->deviated = 0; /* possible submodule */
    }
}